

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O3

void mxx::custom_op<std::pair<unsigned_long,_unsigned_long>,_true>::mpi_user_function
               (void *in,void *inout,int *n,MPI_Datatype *dt)

{
  function<void_(void_*,_void_*,_int_*)> *__x;
  func_t f;
  int local_44;
  _Any_data local_40;
  _Manager_type local_30;
  
  local_44 = 0x543;
  __x = attr_map<int,_std::function<void_(void_*,_void_*,_int_*)>_>::get(dt,&local_44);
  std::function<void_(void_*,_void_*,_int_*)>::function
            ((function<void_(void_*,_void_*,_int_*)> *)&local_40,__x);
  std::function<void_(void_*,_void_*,_int_*)>::operator()
            ((function<void_(void_*,_void_*,_int_*)> *)&local_40,in,inout,n);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return;
}

Assistant:

static void mpi_user_function(void* in, void* inout, int* n, MPI_Datatype* dt) {
        // get the std::function from the MPI_Datatype and call it
        typedef std::function<void(void*,void*,int*)> func_t;
        func_t f = attr_map<int, func_t>::get(*dt, 1347);
        f(in, inout, n);
    }